

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

void BZ2_hbAssignCodes(Int32 *code,UChar *length,Int32 minLen,Int32 maxLen,Int32 alphaSize)

{
  Int32 i;
  Int32 vec;
  Int32 n;
  Int32 alphaSize_local;
  Int32 maxLen_local;
  Int32 minLen_local;
  UChar *length_local;
  Int32 *code_local;
  
  vec = 0;
  for (n = minLen; n <= maxLen; n = n + 1) {
    for (i = 0; i < alphaSize; i = i + 1) {
      if ((uint)length[i] == n) {
        code[i] = vec;
        vec = vec + 1;
      }
    }
    vec = vec << 1;
  }
  return;
}

Assistant:

void BZ2_hbAssignCodes ( Int32 *code,
                         UChar *length,
                         Int32 minLen,
                         Int32 maxLen,
                         Int32 alphaSize )
{
   Int32 n, vec, i;

   vec = 0;
   for (n = minLen; n <= maxLen; n++) {
      for (i = 0; i < alphaSize; i++)
         if (length[i] == n) { code[i] = vec; vec++; };
      vec <<= 1;
   }
}